

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeCostsInterface(Highs *this,HighsIndexCollection *index_collection,double *cost)

{
  byte bVar1;
  bool bVar2;
  reference pvVar3;
  HighsOptions *in_RDX;
  HighsIndexCollection *in_RSI;
  long in_RDI;
  HEkk *pHVar4;
  HighsInt iCol;
  double cost_scale_value;
  HighsLp *lp;
  bool local_has_infinite_cost;
  HighsStatus return_status;
  vector<double,_std::allocator<double>_> local_colCost;
  HighsInt num_cost;
  HighsLogOptions *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  HEkk *in_stack_fffffffffffffe68;
  LpAction action;
  HEkk *in_stack_fffffffffffffe70;
  undefined7 in_stack_fffffffffffffe78;
  undefined1 in_stack_fffffffffffffe7f;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  HighsIndexCollection *in_stack_fffffffffffffe88;
  allocator *paVar5;
  undefined4 in_stack_fffffffffffffe90;
  HighsInt in_stack_fffffffffffffe94;
  string *message;
  HighsIndexCollection *index_collection_00;
  undefined7 in_stack_fffffffffffffeb0;
  int local_124;
  allocator local_109;
  string local_108 [135];
  byte local_81;
  HighsStatus local_80;
  undefined1 local_79 [48];
  allocator local_49;
  string local_48 [36];
  HighsInt local_24;
  HighsOptions *local_20;
  HighsStatus local_4;
  
  local_20 = in_RDX;
  local_24 = dataSize(in_RSI);
  if (local_24 < 1) {
    return kOk;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"column costs",&local_49);
  bVar1 = doubleUserDataNotNull
                    ((HighsLogOptions *)
                     CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                     (double *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                     (string *)in_stack_fffffffffffffe70);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if ((bVar1 & 1) != 0) {
    return kError;
  }
  message = (string *)(&(local_20->super_HighsOptionsStruct)._vptr_HighsOptionsStruct + local_24);
  index_collection_00 = (HighsIndexCollection *)local_79;
  std::allocator<double>::allocator((allocator<double> *)0x4db3fe);
  std::vector<double,std::allocator<double>>::vector<double_const*,void>
            ((vector<double,_std::allocator<double>_> *)message,(double *)local_20,
             (double *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             (allocator_type *)in_stack_fffffffffffffe88);
  std::allocator<double>::~allocator((allocator<double> *)0x4db429);
  local_80 = 0;
  local_81 = 0;
  HighsLogOptions::HighsLogOptions
            ((HighsLogOptions *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  assessCosts(local_20,in_stack_fffffffffffffe94,in_stack_fffffffffffffe88,
              (vector<double,_std::allocator<double>_> *)
              CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
              (bool *)CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
              (double)in_stack_fffffffffffffe70);
  paVar5 = &local_109;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"assessCosts",paVar5);
  local_80 = interpretCallStatus((HighsLogOptions *)CONCAT17(bVar1,in_stack_fffffffffffffeb0),
                                 (HighsStatus)((ulong)index_collection_00 >> 0x20),
                                 (HighsStatus)index_collection_00,message);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x4db520);
  if (local_80 == kError) {
    local_4 = local_80;
  }
  else {
    if (*(int *)(in_RDI + 0x33c) != 0) {
      bVar2 = costScaleOk((vector<double,_std::allocator<double>_> *)
                          CONCAT17(in_stack_fffffffffffffe7f,in_stack_fffffffffffffe78),
                          (HighsInt)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                          (double)in_stack_fffffffffffffe68);
      if (!bVar2) {
        highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                     "User cost scaling yields infinite cost\n");
        local_4 = kError;
        goto LAB_004db7c1;
      }
      pHVar4 = (HEkk *)std::pow<int,int>(0,0x4db6ab);
      in_stack_fffffffffffffe70 = pHVar4;
      for (local_124 = 0; local_124 < local_24; local_124 = local_124 + 1) {
        in_stack_fffffffffffffe68 = pHVar4;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_79 + 1),
                            (long)local_124);
        *pvVar3 = (double)in_stack_fffffffffffffe68 * *pvVar3;
      }
    }
    action = (LpAction)((ulong)in_stack_fffffffffffffe68 >> 0x20);
    changeLpCosts((HighsLp *)CONCAT17(bVar1,in_stack_fffffffffffffeb0),index_collection_00,
                  (vector<double,_std::allocator<double>_> *)message,(double)local_20);
    bVar1 = 1;
    if ((*(byte *)(in_RDI + 0x390) & 1) == 0) {
      bVar1 = local_81;
    }
    *(byte *)(in_RDI + 0x390) = bVar1 & 1;
    invalidateModelStatusSolutionAndInfo((Highs *)CONCAT17(bVar1,in_stack_fffffffffffffe60));
    HEkk::updateStatus(in_stack_fffffffffffffe70,action);
    local_4 = kOk;
  }
LAB_004db7c1:
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe70);
  return local_4;
}

Assistant:

HighsStatus Highs::changeCostsInterface(HighsIndexCollection& index_collection,
                                        const double* cost) {
  HighsInt num_cost = dataSize(index_collection);
  // If a non-positive number of costs (may) need changing nothing needs to be
  // done
  if (num_cost <= 0) return HighsStatus::kOk;
  if (doubleUserDataNotNull(options_.log_options, cost, "column costs"))
    return HighsStatus::kError;
  // Take a copy of the cost that can be normalised
  std::vector<double> local_colCost{cost, cost + num_cost};
  HighsStatus return_status = HighsStatus::kOk;
  bool local_has_infinite_cost = false;
  return_status = interpretCallStatus(
      options_.log_options,
      assessCosts(options_, 0, index_collection, local_colCost,
                  local_has_infinite_cost, options_.infinite_cost),
      return_status, "assessCosts");
  if (return_status == HighsStatus::kError) return return_status;
  HighsLp& lp = model_.lp_;
  if (lp.user_cost_scale_) {
    // Assess and apply any user cost scaling
    if (!costScaleOk(local_colCost, lp.user_cost_scale_,
                     options_.infinite_cost)) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "User cost scaling yields infinite cost\n");
      return HighsStatus::kError;
    }
    double cost_scale_value = std::pow(2, lp.user_cost_scale_);
    for (HighsInt iCol = 0; iCol < num_cost; iCol++)
      local_colCost[iCol] *= cost_scale_value;
  }
  changeLpCosts(lp, index_collection, local_colCost, options_.infinite_cost);

  // Interpret possible introduction of infinite costs
  lp.has_infinite_cost_ = lp.has_infinite_cost_ || local_has_infinite_cost;
  assert(lp.has_infinite_cost_ == lp.hasInfiniteCost(options_.infinite_cost));

  // Deduce the consequences of new costs
  invalidateModelStatusSolutionAndInfo();
  // Determine any implications for simplex data
  ekk_instance_.updateStatus(LpAction::kNewCosts);
  return HighsStatus::kOk;
}